

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testGroupStarting
          (StreamingReporterBase<Catch::CompactReporter> *this,GroupInfo *_groupInfo)

{
  LazyStat<Catch::GroupInfo>::operator=(&this->currentGroupInfo,_groupInfo);
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }